

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O0

int Extra_FileIsType(char *pFileName,char *pS1,char *pS2,char *pS3)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int local_50;
  int local_48;
  int local_40;
  int lenF;
  int lenS;
  char *pS3_local;
  char *pS2_local;
  char *pS1_local;
  char *pFileName_local;
  
  sVar3 = strlen(pFileName);
  iVar2 = (int)sVar3;
  if (pS1 == (char *)0x0) {
    local_40 = 0;
  }
  else {
    sVar3 = strlen(pS1);
    local_40 = (int)sVar3;
  }
  if (((local_40 != 0) && (local_40 < iVar2)) &&
     (iVar1 = strncmp(pFileName + ((long)iVar2 - (long)local_40),pS1,(long)local_40), iVar1 == 0)) {
    return 1;
  }
  if (pS2 == (char *)0x0) {
    local_48 = 0;
  }
  else {
    sVar3 = strlen(pS2);
    local_48 = (int)sVar3;
  }
  if (((local_48 != 0) && (local_48 < iVar2)) &&
     (iVar1 = strncmp(pFileName + ((long)iVar2 - (long)local_48),pS2,(long)local_48), iVar1 == 0)) {
    return 1;
  }
  if (pS3 == (char *)0x0) {
    local_50 = 0;
  }
  else {
    sVar3 = strlen(pS3);
    local_50 = (int)sVar3;
  }
  if (((local_50 != 0) && (local_50 < iVar2)) &&
     (iVar2 = strncmp(pFileName + ((long)iVar2 - (long)local_50),pS3,(long)local_50), iVar2 == 0)) {
    return 1;
  }
  return 0;
}

Assistant:

int Extra_FileIsType( char * pFileName, char * pS1, char * pS2, char * pS3 )
{
    int lenS, lenF = strlen(pFileName);
    lenS = pS1 ? strlen(pS1) : 0;
    if ( lenS && lenF > lenS && !strncmp( pFileName+lenF-lenS, pS1, lenS ) )
        return 1;
    lenS = pS2 ? strlen(pS2) : 0;
    if ( lenS && lenF > lenS && !strncmp( pFileName+lenF-lenS, pS2, lenS ) )
        return 1;
    lenS = pS3 ? strlen(pS3) : 0;
    if ( lenS && lenF > lenS && !strncmp( pFileName+lenF-lenS, pS3, lenS ) )
        return 1;
    return 0;
}